

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O1

void __thiscall CMapLayers::CMapLayers(CMapLayers *this,int Type)

{
  (this->super_CComponent)._vptr_CComponent = (_func_int **)&PTR__CMapLayers_002142d8;
  (this->m_lEnvPoints).list = (CEnvPoint *)0x0;
  array<CEnvPoint,_allocator_default<CEnvPoint>_>::clear(&this->m_lEnvPoints);
  (this->m_lEnvPointsMenu).list = (CEnvPoint *)0x0;
  array<CEnvPoint,_allocator_default<CEnvPoint>_>::clear(&this->m_lEnvPointsMenu);
  this->m_Type = Type;
  this->m_OnlineStartTime = 0.0;
  this->m_pMenuLayers = (CLayers *)0x0;
  this->m_pMenuMap = (IEngineMap *)0x0;
  return;
}

Assistant:

CMapLayers::CMapLayers(int Type)
{
	m_Type = Type;
	m_pMenuMap = 0;
	m_pMenuLayers = 0;
	m_OnlineStartTime = 0;
}